

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_firstwrite(Curl_easy *data)

{
  connectdata *conn_00;
  _Bool _Var1;
  SingleRequest *k;
  connectdata *conn;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  if ((data->req).newurl != (char *)0x0) {
    if (((ulong)conn_00->bits >> 5 & 1) != 0) {
      (data->req).keepon = (data->req).keepon & 0xfffffffe;
      *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xfffffffd | 2;
      return CURLE_OK;
    }
    *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xfffffbff | 0x400;
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"Ignoring the response-body");
    }
  }
  if (((((data->state).resume_from == 0) || ((*(uint *)&(data->req).field_0xd9 >> 2 & 1) != 0)) ||
      ((data->state).httpreq != '\0')) || ((*(uint *)&(data->req).field_0xd9 >> 10 & 1) != 0)) {
    if ((((data->set).timecondition == '\0') || ((data->state).range != (char *)0x0)) ||
       (_Var1 = Curl_meets_timecondition(data,(data->req).timeofdoc), _Var1)) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xfffffffd | 2;
      (data->info).httpcode = 0x130;
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"Simulate an HTTP 304 response");
      }
      Curl_conncontrol(conn_00,2);
      data_local._4_4_ = CURLE_OK;
    }
  }
  else if ((data->req).size == (data->state).resume_from) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"The entire document is already downloaded");
    }
    Curl_conncontrol(conn_00,2);
    (data->req).keepon = (data->req).keepon & 0xfffffffe;
    *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xfffffffd | 2;
    data_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_failf(data,"HTTP server does not seem to support byte ranges. Cannot resume.");
    data_local._4_4_ = CURLE_RANGE_ERROR;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http_firstwrite(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  struct SingleRequest *k = &data->req;

  if(data->req.newurl) {
    if(conn->bits.close) {
      /* Abort after the headers if "follow Location" is set
         and we are set to close anyway. */
      k->keepon &= ~KEEP_RECV;
      k->done = TRUE;
      return CURLE_OK;
    }
    /* We have a new URL to load, but since we want to be able to reuse this
       connection properly, we read the full response in "ignore more" */
    k->ignorebody = TRUE;
    infof(data, "Ignoring the response-body");
  }
  if(data->state.resume_from && !k->content_range &&
     (data->state.httpreq == HTTPREQ_GET) &&
     !k->ignorebody) {

    if(k->size == data->state.resume_from) {
      /* The resume point is at the end of file, consider this fine even if it
         does not allow resume from here. */
      infof(data, "The entire document is already downloaded");
      streamclose(conn, "already downloaded");
      /* Abort download */
      k->keepon &= ~KEEP_RECV;
      k->done = TRUE;
      return CURLE_OK;
    }

    /* we wanted to resume a download, although the server does not seem to
     * support this and we did this with a GET (if it was not a GET we did a
     * POST or PUT resume) */
    failf(data, "HTTP server does not seem to support "
          "byte ranges. Cannot resume.");
    return CURLE_RANGE_ERROR;
  }

  if(data->set.timecondition && !data->state.range) {
    /* A time condition has been set AND no ranges have been requested. This
       seems to be what chapter 13.3.4 of RFC 2616 defines to be the correct
       action for an HTTP/1.1 client */

    if(!Curl_meets_timecondition(data, k->timeofdoc)) {
      k->done = TRUE;
      /* We are simulating an HTTP 304 from server so we return
         what should have been returned from the server */
      data->info.httpcode = 304;
      infof(data, "Simulate an HTTP 304 response");
      /* we abort the transfer before it is completed == we ruin the
         reuse ability. Close the connection */
      streamclose(conn, "Simulated 304 handling");
      return CURLE_OK;
    }
  } /* we have a time condition */

  return CURLE_OK;
}